

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsPreviewWidget.cpp
# Opt level: O0

void __thiscall KDReports::PreviewWidgetPrivate::fillZoomCombo(PreviewWidgetPrivate *this)

{
  QComboBox *pQVar1;
  QVariant local_f8;
  char16_t local_d2;
  QString local_d0;
  QString local_b8;
  QVariant local_a0;
  char16_t local_6a;
  QString local_68;
  QString local_50;
  double local_38;
  qreal val;
  double *__end1;
  double *__begin1;
  double (*__range1) [11];
  PreviewWidgetPrivate *pPStack_10;
  bool currentZoomFound;
  PreviewWidgetPrivate *this_local;
  
  pPStack_10 = this;
  QComboBox::clear();
  __range1._7_1_ = 0;
  __begin1 = fillZoomCombo::s_zoomFactors;
  val = (qreal)&qt_meta_stringdata_PagePreviewWidget;
  for (__end1 = fillZoomCombo::s_zoomFactors; __end1 != (double *)val; __end1 = __end1 + 1) {
    local_38 = *__end1;
    if (((__range1._7_1_ & 1) == 0) && (this->m_zoomFactor <= local_38 - 0.001)) {
      pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
      QString::number(this->m_zoomFactor * 100.0,(char)&local_68,0x67);
      local_6a = (char16_t)QChar::fromLatin1('%');
      operator+(&local_50,&local_68,(QChar)local_6a);
      QVariant::QVariant(&local_a0,local_38);
      QComboBox::addItem(pQVar1,&local_50,&local_a0);
      QVariant::~QVariant(&local_a0);
      QString::~QString(&local_50);
      QString::~QString(&local_68);
      pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
      QComboBox::count();
      QComboBox::setCurrentIndex((int)pQVar1);
      __range1._7_1_ = 1;
    }
    pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
    QString::number(local_38 * 100.0,(char)&local_d0,0x67);
    local_d2 = (char16_t)QChar::fromLatin1('%');
    operator+(&local_b8,&local_d0,(QChar)local_d2);
    QVariant::QVariant(&local_f8,local_38);
    QComboBox::addItem(pQVar1,&local_b8,&local_f8);
    QVariant::~QVariant(&local_f8);
    QString::~QString(&local_b8);
    QString::~QString(&local_d0);
    if ((local_38 - 0.001 < this->m_zoomFactor) && (this->m_zoomFactor < local_38 + 0.001)) {
      pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.zoomCombo;
      QComboBox::count();
      QComboBox::setCurrentIndex((int)pQVar1);
      __range1._7_1_ = 1;
    }
  }
  return;
}

Assistant:

void KDReports::PreviewWidgetPrivate::fillZoomCombo()
{
    static const double s_zoomFactors[] = {0.125, 0.25, 0.333, 0.5, 0.667, 0.75, 1, 1.25, 1.50, 2, 4};

    zoomCombo->clear();
    bool currentZoomFound = false;
    for (const qreal val : s_zoomFactors) {
        if (!currentZoomFound && m_zoomFactor <= val - 0.001) {
            zoomCombo->addItem(QString::number(m_zoomFactor * 100) + QChar::fromLatin1('%'), QVariant(val));
            zoomCombo->setCurrentIndex(zoomCombo->count() - 1);
            currentZoomFound = true;
        }
        zoomCombo->addItem(QString::number(val * 100) + QChar::fromLatin1('%'), QVariant(val));
        if (m_zoomFactor > val - 0.001 && m_zoomFactor < val + 0.001) {
            zoomCombo->setCurrentIndex(zoomCombo->count() - 1);
            currentZoomFound = true;
        }
    }
}